

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore_builder.cpp
# Opt level: O2

void __thiscall embree::sse2::BVH::BVH(BVH *this,Device *device)

{
  MemoryMonitorInterface *pMVar1;
  
  (this->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__BVH_021d3f78;
  this->device = device;
  FastAllocator::FastAllocator(&this->allocator,device,true,false,true);
  pMVar1 = &device->super_MemoryMonitorInterface;
  if (device == (Device *)0x0) {
    pMVar1 = (MemoryMonitorInterface *)0x0;
  }
  (this->morton_src).alloc.device = pMVar1;
  (this->morton_src).alloc.hugepages = false;
  (this->morton_src).size_active = 0;
  (this->morton_src).size_alloced = 0;
  (this->morton_src).items = (BuildPrim *)0x0;
  (this->morton_tmp).alloc.device = pMVar1;
  (this->morton_tmp).alloc.hugepages = false;
  (this->morton_tmp).size_active = 0;
  (this->morton_tmp).size_alloced = 0;
  (this->morton_tmp).items = (BuildPrim *)0x0;
  (*(device->super_State).super_RefCount._vptr_RefCount[2])(device);
  return;
}

Assistant:

BVH (Device* device)
        : device(device), allocator(device,true), morton_src(device,0), morton_tmp(device,0)
      {
        device->refInc();
      }